

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void lemma24(void)

{
  return;
}

Assistant:

void lemma24()
{
	/* We can assume that both B1 and B2 are nonempty and that A intersects ab (else the lemma is trivially correct).
	 * By attaching B1 U B2 to A, we obtain a simple closed curve within D, which is, therefore, the boundary of a subset R of D homeomorphic to a disk.
	 * If a (resp. b) belongs to B1 U B2, then the segment aa' (resp. bb') lies within R and thus, acting like a chord, subdivides R into two regions.
	 * Since aa' and bb' cannot intersect, together they subdivide R into two regions.  The boundary of each such region intersects the boundary of D in
	 * a single connected arc and therefore avoids one Bi (outside of a and b) entirely.  Figure 2.8 illustrates the two possbile cases; note that the third case, where the counterclockwise traversal from c to d
	 * avoids a and b, was eliminated earlier, since it corresponds to a situation where one of the Bi's is empty.  None of the curves obtained by removing a' and b' (if they exist) from A can belong
	 * to more than one of the subdividing regions, so each of them is shielded from some Bi.  Which one can be determined by simple examination of the relative order of the poinst a, b, c, d, a', b',
	 * around the boundary of R. */
}